

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t archive_read_format_tar_options(archive_read *a,char *key,char *val)

{
  int iVar1;
  archive_string_conv *paVar2;
  archive *in_RDX;
  char *in_RSI;
  archive *in_RDI;
  wchar_t ret;
  tar *tar;
  bool local_2f;
  bool local_2e;
  bool local_2d;
  char *charset;
  wchar_t local_4;
  
  local_4 = L'\xffffffe7';
  charset = *(char **)in_RDI[0x15].archive_format_name;
  iVar1 = strcmp(in_RSI,"compat-2x");
  if (iVar1 == 0) {
    local_2d = false;
    if (in_RDX != (archive *)0x0) {
      local_2d = (char)in_RDX->magic != '\0';
    }
    *(uint *)(charset + 0x1a4) = (uint)local_2d;
    *(undefined4 *)(charset + 0x1a0) = *(undefined4 *)(charset + 0x1a4);
    local_4 = L'\0';
  }
  else {
    iVar1 = strcmp(in_RSI,"hdrcharset");
    if (iVar1 == 0) {
      if ((in_RDX == (archive *)0x0) || ((char)in_RDX->magic == '\0')) {
        archive_set_error(in_RDI,-1,"tar: hdrcharset option needs a character-set name");
      }
      else {
        paVar2 = archive_string_conversion_from_charset(in_RDX,charset,local_4);
        *(archive_string_conv **)(charset + 0x180) = paVar2;
        if (*(long *)(charset + 0x180) == 0) {
          local_4 = L'\xffffffe2';
        }
        else {
          local_4 = L'\0';
        }
      }
    }
    else {
      iVar1 = strcmp(in_RSI,"mac-ext");
      if (iVar1 == 0) {
        local_2e = false;
        if (in_RDX != (archive *)0x0) {
          local_2e = (char)in_RDX->magic != '\0';
        }
        *(uint *)(charset + 0x1a8) = (uint)local_2e;
        local_4 = L'\0';
      }
      else {
        iVar1 = strcmp(in_RSI,"read_concatenated_archives");
        if (iVar1 == 0) {
          local_2f = false;
          if (in_RDX != (archive *)0x0) {
            local_2f = (char)in_RDX->magic != '\0';
          }
          *(uint *)(charset + 0x1ac) = (uint)local_2f;
          local_4 = L'\0';
        }
        else {
          local_4 = L'\xffffffec';
        }
      }
    }
  }
  return local_4;
}

Assistant:

static int
archive_read_format_tar_options(struct archive_read *a,
    const char *key, const char *val)
{
	struct tar *tar;
	int ret = ARCHIVE_FAILED;

	tar = (struct tar *)(a->format->data);
	if (strcmp(key, "compat-2x")  == 0) {
		/* Handle UTF-8 filnames as libarchive 2.x */
		tar->compat_2x = (val != NULL && val[0] != 0);
		tar->init_default_conversion = tar->compat_2x;
		return (ARCHIVE_OK);
	} else if (strcmp(key, "hdrcharset")  == 0) {
		if (val == NULL || val[0] == 0)
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "tar: hdrcharset option needs a character-set name");
		else {
			tar->opt_sconv =
			    archive_string_conversion_from_charset(
				&a->archive, val, 0);
			if (tar->opt_sconv != NULL)
				ret = ARCHIVE_OK;
			else
				ret = ARCHIVE_FATAL;
		}
		return (ret);
	} else if (strcmp(key, "mac-ext") == 0) {
		tar->process_mac_extensions = (val != NULL && val[0] != 0);
		return (ARCHIVE_OK);
	} else if (strcmp(key, "read_concatenated_archives") == 0) {
		tar->read_concatenated_archives = (val != NULL && val[0] != 0);
		return (ARCHIVE_OK);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}